

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<short,_long,_11>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *lhs,long *rhs,short *result)

{
  short sVar1;
  undefined2 *in_RDX;
  undefined8 *in_RSI;
  int64_t tmp;
  long *in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  long lVar2;
  
  AdditionHelper<long,_long,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((long *)*in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  lVar2 = 0;
  sVar1 = std::numeric_limits<short>::max();
  if (lVar2 <= sVar1) {
    lVar2 = 0;
    sVar1 = std::numeric_limits<short>::min();
    if (sVar1 <= lVar2) {
      *in_RDX = 0;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //rhs is std::int64_t, lhs signed
        std::int64_t tmp = 0;

        AdditionHelper< std::int64_t, std::int64_t, AdditionState_CastInt64CheckOverflow >::AdditionThrow< E >( (std::int64_t)lhs, (std::int64_t)rhs, tmp );

        if( tmp <= std::numeric_limits<T>::max() &&
            tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }